

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

opj_bool dwt_decode_v2(opj_tcd_tilecomp_v2_t *tilec,OPJ_UINT32 numres)

{
  opj_bool oVar1;
  DWT1DFN in_stack_00000038;
  OPJ_UINT32 in_stack_00000044;
  opj_tcd_tilecomp_v2_t *in_stack_00000048;
  
  oVar1 = dwt_decode_tile_v2(in_stack_00000048,in_stack_00000044,in_stack_00000038);
  return oVar1;
}

Assistant:

opj_bool dwt_decode_v2(opj_tcd_tilecomp_v2_t* tilec, OPJ_UINT32 numres) {
	return dwt_decode_tile_v2(tilec, numres, &dwt_decode_1);
}